

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O1

void __thiscall Js::AutoRestoreFunctionInfo::~AutoRestoreFunctionInfo(AutoRestoreFunctionInfo *this)

{
  Type *addr;
  FunctionBody *pFVar1;
  FunctionInfo *this_00;
  FunctionBody *this_01;
  ParseableFunctionInfo *pPVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  FunctionInfo *functionInfo;
  
  pFVar1 = (FunctionBody *)this->pfi;
  if (pFVar1 != (FunctionBody *)0x0) {
    this_00 = (pFVar1->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    this_01 = (FunctionBody *)(this_00->functionBodyImpl).ptr;
    if (this_01 != pFVar1) {
      bVar4 = FunctionProxy::IsFunctionBody((FunctionProxy *)this_01);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar4) goto LAB_00781bf2;
        *puVar5 = 0;
      }
      FunctionBody::RedeferFunctionObjectTypes(this_01);
      addr = &this_00->functionBodyImpl;
      *(undefined1 *)&this_00->attributes = (char)this_00->attributes | DeferredParse;
      pPVar2 = this->pfi;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = &pPVar2->super_FunctionProxy;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      FunctionInfo::SetOriginalEntryPoint(this_00,this->originalEntryPoint);
    }
  }
  pPVar2 = this->pfi;
  if (pPVar2 != (ParseableFunctionInfo *)0x0) {
    if (((ParseableFunctionInfo *)
         (((pPVar2->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr == pPVar2) &&
       (bVar4 = FunctionProxy::IsFunctionBody(&pPVar2->super_FunctionProxy), !bVar4)) {
      return;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0xd86,
                                "(this->pfi == nullptr || (this->pfi->GetFunctionInfo()->GetFunctionProxy() == this->pfi && !this->pfi->IsFunctionBody()))"
                                ,
                                "this->pfi == nullptr || (this->pfi->GetFunctionInfo()->GetFunctionProxy() == this->pfi && !this->pfi->IsFunctionBody())"
                               );
    if (!bVar4) {
LAB_00781bf2:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

~AutoRestoreFunctionInfo() {
            if (this->pfi != nullptr && this->pfi->GetFunctionInfo()->GetFunctionProxy() != this->pfi)
            {
                FunctionInfo *functionInfo = this->pfi->GetFunctionInfo();
                FunctionBody *functionBody = functionInfo->GetFunctionProxy()->GetFunctionBody();
                functionBody->RedeferFunctionObjectTypes();
                functionInfo->SetAttributes(
                    (FunctionInfo::Attributes)(functionInfo->GetAttributes() | FunctionInfo::Attributes::DeferredParse));
                functionInfo->SetFunctionProxy(this->pfi);
                functionInfo->SetOriginalEntryPoint(originalEntryPoint);
            }

            Assert(this->pfi == nullptr || (this->pfi->GetFunctionInfo()->GetFunctionProxy() == this->pfi && !this->pfi->IsFunctionBody()));
        }